

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution1D_x86::create_pipeline(Convolution1D_x86 *this,Option *opt)

{
  uint _c;
  _func_int *p_Var1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  int _h;
  undefined4 *puVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  undefined4 *puVar12;
  int p;
  long lVar13;
  undefined4 *puVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  Mat local_78;
  
  p_Var1 = this->_vptr_Convolution1D_x86[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var1) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var1);
    uVar8 = (long)*(int *)(&this->field_0xf0 + (long)p_Var1) /
            (long)*(int *)(&this->field_0xd4 + (long)p_Var1);
    uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)(int)_c;
    _h = (int)uVar8;
    if (opt->use_packing_layout == true) {
      uVar15 = (uint)((uVar8 & 3) == 0) * 3 + 1;
      uVar17 = (ulong)((uint)((_c & 3) == 0) * 3 + 1);
    }
    else {
      uVar15 = 1;
      uVar17 = 1;
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var1),
                 *(int *)(&this->field_0xd4 + (long)p_Var1),_h,_c,(Allocator *)0x0);
    iVar16 = (int)uVar17;
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                     (long)(int)uVar15),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / iVar16,
                (ulong)(iVar16 * uVar15 * 4),iVar16 * uVar15,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Convolution1D_x86;
    pvVar3 = (this->weight_data_packed).data;
    sVar4 = (this->weight_data_packed).cstep;
    sVar5 = (this->weight_data_packed).elemsize;
    for (uVar8 = 0;
        (long)((iVar16 - 1) + uVar8) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        uVar8 = uVar8 + uVar17) {
      puVar7 = (undefined4 *)(((uVar8 & 0xffffffff) / uVar17) * sVar4 * sVar5 + (long)pvVar3);
      pp_Var6 = this->_vptr_Convolution1D_x86;
      for (lVar13 = 0; lVar13 < (long)((long)_h - (ulong)(uVar15 - 1));
          lVar13 = lVar13 + (ulong)uVar15) {
        puVar12 = (undefined4 *)
                  ((local_78.w * lVar13 + uVar8 * local_78.cstep) * local_78.elemsize +
                  (long)local_78.data);
        for (lVar11 = 0; lVar11 < *(int *)(&this->field_0xd4 + (long)pp_Var6[-3]);
            lVar11 = lVar11 + 1) {
          puVar9 = puVar12;
          for (uVar10 = 0; puVar14 = puVar9, uVar18 = uVar17, uVar10 != uVar15; uVar10 = uVar10 + 1)
          {
            while (uVar18 != 0) {
              *puVar7 = *puVar14;
              puVar7 = puVar7 + 1;
              puVar14 = (undefined4 *)((long)puVar14 + local_78.cstep * local_78.elemsize);
              uVar18 = uVar18 - 1;
            }
            puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          }
          puVar12 = puVar12 + 1;
        }
      }
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}